

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O1

int av1_active_h_edge(AV1_COMP *cpi,int mi_row,int mi_step)

{
  STATS_BUFFER_CTX *pSVar1;
  int iVar2;
  int iVar3;
  FIRSTPASS_STATS *pFVar4;
  long lVar5;
  FIRSTPASS_STATS *pFVar6;
  
  iVar2 = (cpi->common).mi_params.mi_rows;
  iVar3 = 0;
  if (AOM_RC_FIRST_PASS < (cpi->oxcf).pass) {
    lVar5 = (long)(int)(cpi->common).current_frame.display_order_hint;
    iVar3 = 0;
    if (lVar5 < 0) {
      pFVar4 = (FIRSTPASS_STATS *)0x0;
    }
    else {
      pSVar1 = (cpi->ppi->twopass).stats_buf_ctx;
      pFVar6 = pSVar1->stats_in_start + lVar5;
      pFVar4 = (FIRSTPASS_STATS *)0x0;
      if (pFVar6 <= pSVar1->stats_in_end) {
        pFVar4 = pFVar6;
      }
    }
    if (pFVar4 != (FIRSTPASS_STATS *)0x0) {
      iVar3 = (int)(pFVar4->inactive_zone_rows * 4.0);
      iVar2 = iVar2 - iVar3;
      if (iVar2 <= iVar3) {
        iVar2 = iVar3;
      }
    }
    if (pFVar4 == (FIRSTPASS_STATS *)0x0) {
      return 1;
    }
  }
  if ((iVar3 < mi_row || mi_step + mi_row <= iVar3) && (mi_step + mi_row <= iVar2 || iVar2 < mi_row)
     ) {
    return 0;
  }
  return 1;
}

Assistant:

int av1_active_h_edge(const AV1_COMP *cpi, int mi_row, int mi_step) {
  int top_edge = 0;
  int bottom_edge = cpi->common.mi_params.mi_rows;
  int is_active_h_edge = 0;

  // For two pass account for any formatting bars detected.
  if (is_stat_consumption_stage_twopass(cpi)) {
    const AV1_COMMON *const cm = &cpi->common;
    const FIRSTPASS_STATS *const this_frame_stats = read_one_frame_stats(
        &cpi->ppi->twopass, cm->current_frame.display_order_hint);
    if (this_frame_stats == NULL) return AOM_CODEC_ERROR;

    // The inactive region is specified in MBs not mi units.
    // The image edge is in the following MB row.
    top_edge += (int)(this_frame_stats->inactive_zone_rows * 4);

    bottom_edge -= (int)(this_frame_stats->inactive_zone_rows * 4);
    bottom_edge = AOMMAX(top_edge, bottom_edge);
  }

  if (((top_edge >= mi_row) && (top_edge < (mi_row + mi_step))) ||
      ((bottom_edge >= mi_row) && (bottom_edge < (mi_row + mi_step)))) {
    is_active_h_edge = 1;
  }
  return is_active_h_edge;
}